

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::Grow
          (RepeatedField<absl::lts_20250127::Cord> *this,bool was_soo,int old_size,int new_size)

{
  int old_size_00;
  
  UnpoisonBuffer(this);
  GrowNoAnnotate(this,was_soo,old_size,new_size);
  old_size_00 = 0;
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0) {
    old_size_00 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  AnnotateSize(this,old_size_00,old_size);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::Grow(bool was_soo, int old_size,
                                                    int new_size) {
  UnpoisonBuffer();
  GrowNoAnnotate(was_soo, old_size, new_size);
  AnnotateSize(Capacity(), old_size);
}